

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O3

bool google::protobuf::compiler::cpp::IsWellKnownMessage(FileDescriptor *file)

{
  int iVar1;
  const_iterator cVar2;
  long lVar3;
  undefined1 local_1a3;
  undefined1 local_1a2;
  undefined1 local_1a1;
  undefined1 *local_1a0 [2];
  undefined1 local_190 [16];
  undefined1 *local_180 [2];
  undefined1 local_170 [16];
  undefined1 *local_160 [2];
  undefined1 local_150 [16];
  undefined1 *local_140 [2];
  undefined1 local_130 [16];
  undefined1 *local_120 [2];
  undefined1 local_110 [16];
  undefined1 *local_100 [2];
  undefined1 local_f0 [16];
  undefined1 *local_e0 [2];
  undefined1 local_d0 [16];
  undefined1 *local_c0 [2];
  undefined1 local_b0 [16];
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if (IsWellKnownMessage(google::protobuf::FileDescriptor_const*)::well_known_files_abi_cxx11_ ==
      '\0') {
    iVar1 = __cxa_guard_acquire(&IsWellKnownMessage(google::protobuf::FileDescriptor_const*)::
                                 well_known_files_abi_cxx11_);
    if (iVar1 != 0) {
      local_1a0[0] = local_190;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a0,"google/protobuf/any.proto","");
      local_180[0] = local_170;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_180,"google/protobuf/api.proto","");
      local_160[0] = local_150;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_160,"google/protobuf/compiler/plugin.proto","");
      local_140[0] = local_130;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_140,"google/protobuf/descriptor.proto","");
      local_120[0] = local_110;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_120,"google/protobuf/duration.proto","");
      local_100[0] = local_f0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_100,"google/protobuf/empty.proto","");
      local_e0[0] = local_d0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_e0,"google/protobuf/field_mask.proto","");
      local_c0[0] = local_b0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_c0,"google/protobuf/source_context.proto","");
      local_a0[0] = local_90;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_a0,"google/protobuf/struct.proto","");
      local_80[0] = local_70;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_80,"google/protobuf/timestamp.proto","");
      local_60[0] = local_50;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_60,"google/protobuf/type.proto","");
      local_40[0] = local_30;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_40,"google/protobuf/wrappers.proto","");
      std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::_Hashtable<std::__cxx11::string_const*>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&IsWellKnownMessage(google::protobuf::FileDescriptor_const*)::
                     well_known_files_abi_cxx11_,local_1a0,&stack0xffffffffffffffe0,0,&local_1a1,
                 &local_1a2,&local_1a3);
      lVar3 = 0;
      do {
        if (local_30 + lVar3 != *(undefined1 **)((long)local_40 + lVar3)) {
          operator_delete(*(undefined1 **)((long)local_40 + lVar3));
        }
        lVar3 = lVar3 + -0x20;
      } while (lVar3 != -0x180);
      __cxa_atexit(std::
                   unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~unordered_set,
                   &IsWellKnownMessage(google::protobuf::FileDescriptor_const*)::
                    well_known_files_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&IsWellKnownMessage(google::protobuf::FileDescriptor_const*)::
                           well_known_files_abi_cxx11_);
    }
  }
  cVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::find(&IsWellKnownMessage(google::protobuf::FileDescriptor_const*)::
                  well_known_files_abi_cxx11_._M_h,*(key_type **)file);
  return cVar2.
         super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
         ._M_cur != (__node_type *)0x0;
}

Assistant:

bool IsWellKnownMessage(const FileDescriptor* file) {
  static const std::unordered_set<std::string> well_known_files{
      "google/protobuf/any.proto",
      "google/protobuf/api.proto",
      "google/protobuf/compiler/plugin.proto",
      "google/protobuf/descriptor.proto",
      "google/protobuf/duration.proto",
      "google/protobuf/empty.proto",
      "google/protobuf/field_mask.proto",
      "google/protobuf/source_context.proto",
      "google/protobuf/struct.proto",
      "google/protobuf/timestamp.proto",
      "google/protobuf/type.proto",
      "google/protobuf/wrappers.proto",
  };
  return well_known_files.find(file->name()) != well_known_files.end();
}